

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::IFF_PDU::Decode(IFF_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  undefined2 uVar1;
  KUINT8 KVar2;
  KUINT16 KVar3;
  KUINT16 KVar4;
  SystemType SVar5;
  IFF_Layer3Transponder *this_00;
  KException *pKVar6;
  int iVar7;
  undefined7 in_register_00000011;
  short sVar8;
  LayerHeader hdr;
  KString local_68;
  SystemIdentifier *local_48;
  LayerHeader local_40;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar7 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar7 = 0;
  }
  if (iVar7 + (uint)KVar3 < 0x3c) {
    pKVar6 = (KException *)__cxa_allocate_exception(0x30);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Decode","");
    KException::KException(pKVar6,&local_68,2);
    __cxa_throw(pKVar6,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  KVar3 = KDataStream::GetBufferSize(stream);
  (*(this->m_EmittingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EmittingEntityID,stream);
  (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EventID,stream);
  (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Location,stream);
  local_48 = &this->m_SystemID;
  (*(this->m_SystemID).super_DataTypeBase._vptr_DataTypeBase[3])(local_48,stream);
  KDataStream::Read(stream,&this->m_ui8SystemDesignator);
  KDataStream::Read(stream,&this->m_ui8SystemSpecific);
  (*(this->m_FOD).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_FOD,stream);
  uVar1 = (this->super_Header).super_Header6.m_ui16PDULength;
  KVar4 = KDataStream::GetBufferSize(stream);
  sVar8 = KVar4 + (uVar1 - KVar3) + -0xc;
  if (sVar8 != 0) {
    do {
      DATA_TYPE::LayerHeader::LayerHeader(&local_40,stream);
      KVar2 = DATA_TYPE::LayerHeader::GetLayerNumber(&local_40);
      if (KVar2 == '\x02') {
        this_00 = (IFF_Layer3Transponder *)operator_new(0x58);
        DATA_TYPE::IFF_Layer2::IFF_Layer2((IFF_Layer2 *)this_00,&local_40,stream);
      }
      else {
        if (KVar2 != '\x03') {
          pKVar6 = (KException *)__cxa_allocate_exception(0x30);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Decode","");
          KVar2 = DATA_TYPE::LayerHeader::GetLayerNumber(&local_40);
          KException::KException<unsigned_char>(pKVar6,&local_68,9,KVar2);
          __cxa_throw(pKVar6,&KException::typeinfo,KException::~KException);
        }
        SVar5 = DATA_TYPE::SystemIdentifier::GetSystemType(local_48);
        if (SVar5 < (Soviet_Interrogator|Mark_X_XII_ATCRBS_ModeS_Interrogator)) {
          if ((0x2aU >> (SVar5 & 0x1f) & 1) == 0) {
            this_00 = (IFF_Layer3Transponder *)0x0;
            if ((0x14U >> (SVar5 & 0x1f) & 1) != 0) {
              this_00 = (IFF_Layer3Transponder *)operator_new(0x78);
              DATA_TYPE::IFF_Layer3Interrogator::IFF_Layer3Interrogator
                        ((IFF_Layer3Interrogator *)this_00,&local_40,stream);
            }
          }
          else {
            this_00 = (IFF_Layer3Transponder *)operator_new(0x90);
            DATA_TYPE::IFF_Layer3Transponder::IFF_Layer3Transponder(this_00,&local_40,stream);
          }
        }
        else {
          this_00 = (IFF_Layer3Transponder *)0x0;
        }
      }
      if (this_00 == (IFF_Layer3Transponder *)0x0) {
        pKVar6 = (KException *)__cxa_allocate_exception(0x30);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Decode","");
        KException::KException<char_const*>(pKVar6,&local_68,10,"Layer is null");
        __cxa_throw(pKVar6,&KException::typeinfo,KException::~KException);
      }
      local_68._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022ac78;
      local_68._M_string_length = (size_type)this_00;
      local_68.field_2._M_allocated_capacity = (size_type)operator_new(2);
      *(undefined2 *)local_68.field_2._M_allocated_capacity = 1;
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>>>
                  *)&this->m_vLayers,(KRef_Ptr<KDIS::DATA_TYPE::LayerHeader> *)&local_68);
      local_68._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022ac78;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>::unRef
                ((KRef_Ptr<KDIS::DATA_TYPE::LayerHeader> *)&local_68);
      KVar3 = DATA_TYPE::LayerHeader::GetLayerLength((LayerHeader *)this_00);
      DATA_TYPE::LayerHeader::~LayerHeader(&local_40);
      sVar8 = sVar8 - KVar3;
    } while (sVar8 != 0);
  }
  return;
}

Assistant:

void IFF_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < IFF_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

	// Record the size of the stream so we can calculate how much data is left. We could just use 
	// stream.GetBufferSize() but what if this PDU was part of a PDU bundle...
	KUINT32 streamSizeSnapshot = stream.GetBufferSize();

    stream >> KDIS_STREAM m_EmittingEntityID
           >> KDIS_STREAM m_EventID
           >> KDIS_STREAM m_Location
           >> KDIS_STREAM m_SystemID
           >> m_ui8SystemDesignator
		   >> m_ui8SystemSpecific
           >> KDIS_STREAM m_FOD;
	
	KUINT16 remainingData = m_ui16PDULength - HEADER6_PDU_SIZE - ( streamSizeSnapshot - stream.GetBufferSize() );
	
	// Decode each layer
	while( remainingData )
	{
		LayerHeader hdr( stream );
		LayerHeader * layer = NULL;

		switch ( hdr.GetLayerNumber() )
		{
			case 2: layer = new IFF_Layer2( hdr, stream ); break;

			#if DIS_VERSION > 6
			case 3: 
				switch( m_SystemID.GetSystemType() )
				{
					case Mark_X_XII_ATCRBS_ModeS_Transponder:
					case RRB_Transponder:
					case Soviet_Transponder:
						layer = new IFF_Layer3Transponder( hdr, stream );
						break;

					case Mark_X_XII_ATCRBS_ModeS_Interrogator:
					case Soviet_Interrogator:
						layer = new IFF_Layer3Interrogator( hdr, stream );
						break;
				}							
				break;
			#endif
			
			//case 4: layer = new IFF_Layer4( hdr, stream ); break;
			//case 5: layer = new IFF_Layer5( hdr, stream ); break;
				
			default: throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, hdr.GetLayerNumber() );						
		}

		if( layer )
		{
			m_vLayers.push_back( layer );
			remainingData -= layer->GetLayerLength();
		}
		else
		{
			throw KException( __FUNCTION__, INVALID_OPERATION, "Layer is null" );
		}
	}
}